

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::detail::BufferStream::~BufferStream(BufferStream *this)

{
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__BufferStream_00141760;
  std::__cxx11::string::~string((string *)&this->buffer);
  return;
}

Assistant:

~BufferStream() override = default;